

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O1

void __thiscall rcdiscover::DeviceInfo::set(DeviceInfo *this,uint8_t *raw,size_t len)

{
  int i;
  long lVar1;
  uint uVar2;
  pointer len_00;
  string local_48;
  
  (this->manufacturer_name)._M_string_length = 0;
  this->major = 0;
  this->minor = 0;
  this->mac = 0;
  *(undefined8 *)((long)&this->mac + 4) = 0;
  this->subnet = 0;
  this->gateway = 0;
  *(this->manufacturer_name)._M_dataplus._M_p = '\0';
  (this->model_name)._M_string_length = 0;
  *(this->model_name)._M_dataplus._M_p = '\0';
  (this->device_version)._M_string_length = 0;
  *(this->device_version)._M_dataplus._M_p = '\0';
  (this->manufacturer_info)._M_string_length = 0;
  *(this->manufacturer_info)._M_dataplus._M_p = '\0';
  (this->serial_number)._M_string_length = 0;
  *(this->serial_number)._M_dataplus._M_p = '\0';
  (this->user_name)._M_string_length = 0;
  len_00 = (this->user_name)._M_dataplus._M_p;
  *len_00 = '\0';
  if (3 < len) {
    this->major = (uint)(ushort)(*(ushort *)raw << 8 | *(ushort *)raw >> 8);
    this->minor = (uint)(ushort)(*(ushort *)(raw + 2) << 8 | *(ushort *)(raw + 2) >> 8);
  }
  if (0xf < len) {
    this->mac = 0;
    lVar1 = 0;
    len_00 = (pointer)0x0;
    do {
      len_00 = (pointer)((long)len_00 << 8 | (ulong)raw[lVar1 + 10]);
      this->mac = (uint64_t)len_00;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 6);
  }
  if (0x27 < len) {
    this->ip = 0;
    lVar1 = 0;
    len_00 = (pointer)0x0;
    do {
      uVar2 = (int)len_00 << 8 | (uint)raw[lVar1 + 0x24];
      len_00 = (pointer)(ulong)uVar2;
      this->ip = uVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  if (0x37 < len) {
    this->subnet = 0;
    lVar1 = 0;
    len_00 = (pointer)0x0;
    do {
      uVar2 = (int)len_00 << 8 | (uint)raw[lVar1 + 0x34];
      len_00 = (pointer)(ulong)uVar2;
      this->subnet = uVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  if (0x47 < len) {
    this->gateway = 0;
    lVar1 = 0;
    len_00 = (pointer)0x0;
    do {
      uVar2 = (int)len_00 << 8 | (uint)raw[lVar1 + 0x44];
      len_00 = (pointer)(ulong)uVar2;
      this->gateway = uVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  if (0x67 < len) {
    (anonymous_namespace)::extract_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(raw + 0x48),(uint8_t *)0x20,(size_t)len_00);
    std::__cxx11::string::operator=((string *)&this->manufacturer_name,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x87 < len) {
    (anonymous_namespace)::extract_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(raw + 0x68),(uint8_t *)0x20,(size_t)len_00);
    std::__cxx11::string::operator=((string *)&this->model_name,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (0xa7 < len) {
    (anonymous_namespace)::extract_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(raw + 0x88),(uint8_t *)0x20,(size_t)len_00);
    std::__cxx11::string::operator=((string *)&this->device_version,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (0xd7 < len) {
    (anonymous_namespace)::extract_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(raw + 0xa8),(uint8_t *)0x30,(size_t)len_00);
    std::__cxx11::string::operator=((string *)&this->manufacturer_info,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (0xe7 < len) {
    (anonymous_namespace)::extract_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(raw + 0xd8),(uint8_t *)0x10,(size_t)len_00);
    std::__cxx11::string::operator=((string *)&this->serial_number,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (0xf7 < len) {
    (anonymous_namespace)::extract_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(raw + 0xe8),(uint8_t *)0x10,(size_t)len_00);
    std::__cxx11::string::operator=((string *)&this->user_name,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DeviceInfo::set(const uint8_t *raw, size_t len)
{
  // clear stored information

  clear();

  // extract information

  if (len >= 4)
  {
    major=(static_cast<int>(raw[0])<<8)|raw[1];
    minor=(static_cast<int>(raw[2])<<8)|raw[3];
  }

  if (len >= 16)
  {
    mac=0;
    for (int i=0; i<6; i++) mac=(mac<<8)|raw[10+i];
  }

  if (len >= 40)
  {
    ip=0;
    for (int i=0; i<4; i++) ip=(ip<<8)|raw[36+i];
  }

  if (len >= 56)
  {
    subnet=0;
    for (int i=0; i<4; i++) subnet=(subnet<<8)|raw[52+i];
  }

  if (len >= 72)
  {
    gateway=0;
    for (int i=0; i<4; i++) gateway=(gateway<<8)|raw[68+i];
  }

  if (len >= 104) manufacturer_name=extract(raw+72, 32);
  if (len >= 136) model_name=extract(raw+104, 32);
  if (len >= 168) device_version=extract(raw+136, 32);
  if (len >= 216) manufacturer_info=extract(raw+168, 48);
  if (len >= 232) serial_number=extract(raw+216, 16);
  if (len >= 248) user_name=extract(raw+232, 16);
}